

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

QLayoutItem * __thiscall
QMainWindowLayout::unplug(QMainWindowLayout *this,QWidget *widget,DragScope scope)

{
  QMainWindowLayoutState *this_00;
  QMainWindowLayoutState *other;
  QToolBarAreaLayout *this_01;
  QMainWindowLayout *pQVar1;
  QArrayDataPointer<QDockAreaLayoutItem> *pQVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int *piVar6;
  QArrayData *pQVar7;
  Representation RVar8;
  undefined4 uVar9;
  QSize QVar10;
  QDebug QVar11;
  Data *pDVar12;
  bool bVar13;
  bool bVar14;
  DockWidgetArea DVar15;
  int iVar16;
  int iVar17;
  QWidget *pQVar18;
  QLayout *pQVar19;
  QDockAreaLayoutItem *pQVar20;
  QLoggingCategory *pQVar21;
  long lVar22;
  QDockAreaLayoutInfo *pQVar23;
  QStyle *pQVar24;
  int iVar25;
  char cVar26;
  QArrayDataPointer<QToolBarAreaLayoutLine> *this_02;
  QDebug *this_03;
  int iVar27;
  QDebug unaff_R12;
  QArrayDataPointer<QToolBarAreaLayoutLine> *this_04;
  long in_FS_OFFSET;
  QRect QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QLayoutItem *item_1;
  QLayoutItem *item;
  QDockAreaLayoutItem parentItem;
  undefined1 local_110 [8];
  QSize local_108;
  undefined1 local_100 [8];
  undefined1 local_f8 [12];
  Representation RStack_ec;
  undefined1 local_e8 [8];
  int local_e0;
  int iStack_dc;
  undefined4 uStack_d8;
  undefined8 uStack_d4;
  undefined4 local_cc;
  QWidgetData *local_c8;
  QSize local_c0;
  undefined1 local_b8 [8];
  QDebug local_b0;
  QList<int> local_a8;
  undefined1 local_90 [8];
  QArrayDataPointer<int> local_88;
  undefined1 local_68 [32];
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar18 = (QWidget *)QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
  if ((pQVar18 == (QWidget *)0x0) ||
     (((widget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) {
    this_00 = (QMainWindowLayoutState *)(this + 0x88);
    local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
    QMainWindowLayoutState::indexOf((QList<int> *)&local_88,this_00,widget);
    if ((undefined1 *)local_88.size == (undefined1 *)0x0) {
      unaff_R12.stream = (Stream *)0x0;
    }
    else {
      unaff_R12.stream = (Stream *)QMainWindowLayoutState::item(this_00,(QList<int> *)&local_88);
      local_b0.stream = unaff_R12.stream;
      if (((widget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
        stack0xffffffffffffff10 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
        local_f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        _local_f8 = QMainWindowLayoutState::itemRect(this_00,(QList<int> *)&local_88);
        other = (QMainWindowLayoutState *)(this + 0x3c0);
        *(undefined8 *)(this + 0x3c0) = *(undefined8 *)&this_00->rect;
        *(undefined8 *)(this + 0x3c8) = *(undefined8 *)(this + 0x90);
        *(undefined8 *)(this + 0x3d0) = *(undefined8 *)(this + 0x98);
        this_01 = (QToolBarAreaLayout *)(this + 0x3d8);
        *(undefined8 *)(this + 0x3d8) = *(undefined8 *)(this + 0xa0);
        *(undefined8 *)(this + 0x3e0) = *(undefined8 *)(this + 0xa8);
        *(undefined8 *)(this + 1000) = *(undefined8 *)(this + 0xb0);
        this_04 = (QArrayDataPointer<QToolBarAreaLayoutLine> *)(this + 0x3f0);
        lVar22 = 4;
        this_02 = this_04;
        do {
          QArrayDataPointer<QToolBarAreaLayoutLine>::operator=
                    (this_02,(QArrayDataPointer<QToolBarAreaLayoutLine> *)&this_02[-0x23].size);
          uVar3 = *(undefined8 *)((long)&this_02[-0x21].d + 1);
          uVar4 = *(undefined8 *)((long)&this_02[-0x21].ptr + 1);
          this_02[1].d = (Data *)this_02[-0x22].size;
          this_02[1].ptr = (QToolBarAreaLayoutLine *)this_02[-0x21].d;
          *(undefined8 *)((long)&this_02[1].ptr + 1) = uVar3;
          *(undefined8 *)((long)&this_02[1].size + 1) = uVar4;
          this_02 = (QArrayDataPointer<QToolBarAreaLayoutLine> *)&this_02[2].ptr;
          lVar22 = lVar22 + -1;
        } while (lVar22 != 0);
        this[0x4d0] = this[0x198];
        *(undefined8 *)(this + 0x4d8) = *(undefined8 *)(this + 0x1a0);
        *(undefined8 *)(this + 0x4e0) = *(undefined8 *)(this + 0x1a8);
        *(undefined8 *)(this + 0x4e8) = *(undefined8 *)(this + 0x1b0);
        *(undefined8 *)(this + 0x4f0) = *(undefined8 *)(this + 0x1b8);
        *(undefined8 *)(this + 0x4f8) = *(undefined8 *)(this + 0x1c0);
        *(undefined8 *)(this + 0x500) = *(undefined8 *)(this + 0x1c8);
        *(undefined8 *)(this + 0x508) = *(undefined8 *)(this + 0x1d0);
        *(undefined8 *)(this + 0x510) = *(undefined8 *)(this + 0x1d8);
        lVar22 = 0x1e0;
        do {
          pQVar1 = this + lVar22;
          *(undefined8 *)(pQVar1 + 0x338) = *(undefined8 *)pQVar1;
          QArrayDataPointer<QWidget_*>::operator=
                    ((QArrayDataPointer<QWidget_*> *)(pQVar1 + 0x340),
                     (QArrayDataPointer<QWidget_*> *)(this + lVar22 + 8));
          uVar3 = *(undefined8 *)(this + lVar22 + 0x28);
          uVar4 = *(undefined8 *)(this + lVar22 + 0x30);
          uVar5 = *(undefined8 *)(this + lVar22 + 0x38);
          *(undefined8 *)(pQVar1 + 0x358) = *(undefined8 *)(this + lVar22 + 0x20);
          *(undefined8 *)(pQVar1 + 0x360) = uVar3;
          *(undefined8 *)(pQVar1 + 0x368) = uVar4;
          *(undefined8 *)(pQVar1 + 0x370) = uVar5;
          pQVar2 = (QArrayDataPointer<QDockAreaLayoutItem> *)(this + lVar22 + 0x378);
          QArrayDataPointer<QDockAreaLayoutItem>::operator=
                    (pQVar2,(QArrayDataPointer<QDockAreaLayoutItem> *)(this + lVar22 + 0x40));
          pQVar20 = *(QDockAreaLayoutItem **)(this + lVar22 + 0x60);
          pQVar2[1].d = *(Data **)(this + lVar22 + 0x58);
          pQVar2[1].ptr = pQVar20;
          *(undefined4 *)&pQVar2[1].size = *(undefined4 *)(this + lVar22 + 0x68);
          lVar22 = lVar22 + 0x70;
        } while (lVar22 != 0x3a0);
        this[0x6dc] = this[0x3a4];
        *(undefined4 *)(this + 0x6d8) = *(undefined4 *)(this + 0x3a0);
        QArrayDataPointer<QWidget_*>::operator=
                  ((QArrayDataPointer<QWidget_*> *)(this + 0x6e0),
                   (QArrayDataPointer<QWidget_*> *)(this + 0x3a8));
        pQVar18 = (QWidget *)QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
        if (pQVar18 != (QWidget *)0x0) {
          if (((scope == Group) && (((byte)this[0x700] & 0x20) != 0)) &&
             ((undefined1 *)0x3 < (ulong)local_88.size)) {
            QList<int>::mid(&local_a8,(QList<int> *)&local_88,1,(qsizetype)(local_88.size + -2));
            pQVar20 = QDockAreaLayout::item((QDockAreaLayout *)(this + 0x1a0),&local_a8);
            bVar14 = unplugGroup((QMainWindowLayout *)this,(QLayoutItem **)&local_b0,pQVar20);
            bVar13 = true;
          }
          else {
            bVar13 = false;
            bVar14 = false;
          }
          if ((bVar13) && (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0)) {
            LOCK();
            ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,4,0x10);
            }
          }
          if (bVar14 == false) {
            DVar15 = dockWidgetArea(this,pQVar18);
            if (DVar15 - LeftDockWidgetArea < 2) {
              RStack_ec.m_i = RStack_ec.m_i - *(int *)(this + 0x760);
            }
            else if ((DVar15 == TopDockWidgetArea) || (DVar15 == BottomDockWidgetArea)) {
              local_f8._8_4_ = local_f8._8_4_ - *(int *)(this + 0x760);
            }
            QWidget::layout(pQVar18);
            lVar22 = QMetaObject::cast((QObject *)&QDockWidgetLayout::staticMetaObject);
            if (lVar22 == 0) {
              cVar26 = '\0';
            }
            else {
              cVar26 = *(char *)(lVar22 + 0x1c);
            }
            pQVar24 = QApplication::style();
            if (pQVar24 == (QStyle *)0x0) {
              iVar16 = 0x14;
            }
            else {
              pQVar24 = QApplication::style();
              iVar16 = (**(code **)(*(long *)pQVar24 + 0xe0))(pQVar24,0x1a,0,pQVar18);
            }
            iVar25 = iVar16 * 2;
            if (cVar26 != '\0') {
              iVar25 = iVar16;
              iVar16 = iVar16 * 2;
            }
            uVar9 = local_f8._4_4_;
            iVar17 = (local_f8._8_4_ - local_f8._0_4_) + 1;
            iVar27 = (RStack_ec.m_i - local_f8._4_4_) + 1;
            if (iVar17 <= iVar25) {
              iVar17 = iVar25;
            }
            if (iVar27 <= iVar16) {
              iVar27 = iVar16;
            }
            iVar16 = local_f8._0_4_ + -1;
            local_f8._8_4_ = iVar16 + iVar17;
            RStack_ec.m_i = uVar9 + iVar27 + -1;
            pQVar21 = QtPrivateLogging::lcQpaDockWidgets();
            if (((pQVar21->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
              local_68._24_8_ = pQVar21->name;
              local_68._0_4_ = 2;
              local_68._4_4_ = 0;
              local_68._8_4_ = 0;
              local_68._12_4_ = 0;
              local_68._16_4_ = 0;
              local_68._20_4_ = 0;
              QMessageLogger::debug();
              ::operator<<((Stream *)&local_c0,(QDockWidget *)local_110);
              QVar10 = local_c0;
              QVar35.m_data = (storage_type *)0x1b;
              QVar35.m_size = (qsizetype)&local_e0;
              QString::fromUtf8(QVar35);
              QTextStream::operator<<((QTextStream *)QVar10,(QString *)&local_e0);
              piVar6 = (int *)CONCAT44(iStack_dc,local_e0);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  QArrayData::deallocate((QArrayData *)CONCAT44(iStack_dc,local_e0),2,0x10);
                }
              }
              if (*(QTextStream *)((long)local_c0 + 0x30) == (QTextStream)0x1) {
                QTextStream::operator<<((QTextStream *)local_c0,' ');
              }
              local_108 = local_c0;
              *(int *)((long)local_c0 + 0x28) = *(int *)((long)local_c0 + 0x28) + 1;
              local_e0 = (local_f8._8_4_ - local_f8._0_4_) + 1;
              iStack_dc = (RStack_ec.m_i - local_f8._4_4_) + 1;
              ::operator<<((Stream *)local_100,&local_108);
              QDebug::~QDebug((QDebug *)local_100);
              QDebug::~QDebug((QDebug *)&local_108);
              QDebug::~QDebug((QDebug *)&local_c0);
              QDebug::~QDebug((QDebug *)local_110);
            }
            QDockWidgetPrivate::unplug
                      (*(QDockWidgetPrivate **)&pQVar18->field_0x8,(QRect *)local_f8);
          }
          else {
            if ((&(local_88.d)->super_QArrayData == (QArrayData *)0x0) ||
               (1 < ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
              QArrayDataPointer<int>::reallocateAndGrow
                        (&local_88,GrowsAtEnd,0,(QArrayDataPointer<int> *)0x0);
            }
            local_88.size = local_88.size + -1;
            *(undefined8 *)(this + 0x3d0) = *(undefined8 *)(this + 0x98);
            RVar8.m_i = (this_00->rect).y1.m_i;
            uVar3 = *(undefined8 *)(this + 0x90);
            (other->rect).x1 = (Representation)(this_00->rect).x1.m_i;
            (other->rect).y1 = (Representation)RVar8.m_i;
            *(undefined8 *)(this + 0x3c8) = uVar3;
            *(undefined8 *)(this + 1000) = *(undefined8 *)(this + 0xb0);
            uVar3 = *(undefined8 *)(this + 0xa0);
            uVar4 = *(undefined8 *)(this + 0xa8);
            (this_01->rect).x1 = (Representation)(int)uVar3;
            (this_01->rect).y1 = (Representation)(int)((ulong)uVar3 >> 0x20);
            *(undefined8 *)(this + 0x3e0) = uVar4;
            lVar22 = 4;
            do {
              QArrayDataPointer<QToolBarAreaLayoutLine>::operator=
                        (this_04,(QArrayDataPointer<QToolBarAreaLayoutLine> *)&this_04[-0x23].size);
              uVar3 = *(undefined8 *)((long)&this_04[-0x21].d + 1);
              uVar4 = *(undefined8 *)((long)&this_04[-0x21].ptr + 1);
              this_04[1].d = (Data *)this_04[-0x22].size;
              this_04[1].ptr = (QToolBarAreaLayoutLine *)this_04[-0x21].d;
              *(undefined8 *)((long)&this_04[1].ptr + 1) = uVar3;
              *(undefined8 *)((long)&this_04[1].size + 1) = uVar4;
              this_04 = (QArrayDataPointer<QToolBarAreaLayoutLine> *)&this_04[2].ptr;
              lVar22 = lVar22 + -1;
            } while (lVar22 != 0);
            this[0x4d0] = this[0x198];
            uVar3 = *(undefined8 *)((QDockAreaLayout *)(this + 0x1a0))->corners;
            uVar4 = *(undefined8 *)(this + 0x1a8);
            *(undefined8 *)(this + 0x508) = *(undefined8 *)(this + 0x1d0);
            *(undefined8 *)(this + 0x510) = *(undefined8 *)(this + 0x1d8);
            *(undefined8 *)(this + 0x4f8) = *(undefined8 *)(this + 0x1c0);
            *(undefined8 *)(this + 0x500) = *(undefined8 *)(this + 0x1c8);
            *(undefined8 *)(this + 0x4e8) = *(undefined8 *)(this + 0x1b0);
            *(undefined8 *)(this + 0x4f0) = *(undefined8 *)(this + 0x1b8);
            *(undefined8 *)((QDockAreaLayout *)(this + 0x4d8))->corners = uVar3;
            *(undefined8 *)(this + 0x4e0) = uVar4;
            lVar22 = 0;
            do {
              *(undefined8 *)(this + lVar22 + 0x518) = *(undefined8 *)(this + lVar22 + 0x1e0);
              QArrayDataPointer<QWidget_*>::operator=
                        ((QArrayDataPointer<QWidget_*> *)(this + lVar22 + 0x520),
                         (QArrayDataPointer<QWidget_*> *)(this + lVar22 + 0x1e8));
              *(undefined8 *)(this + lVar22 + 0x538) = *(undefined8 *)(this + lVar22 + 0x200);
              *(undefined8 *)(this + lVar22 + 0x540) = *(undefined8 *)(this + lVar22 + 0x208);
              *(undefined8 *)(this + lVar22 + 0x548) = *(undefined8 *)(this + lVar22 + 0x210);
              *(undefined8 *)(this + lVar22 + 0x550) = *(undefined8 *)(this + lVar22 + 0x218);
              pQVar2 = (QArrayDataPointer<QDockAreaLayoutItem> *)(this + lVar22 + 0x558);
              QArrayDataPointer<QDockAreaLayoutItem>::operator=
                        (pQVar2,(QArrayDataPointer<QDockAreaLayoutItem> *)(this + lVar22 + 0x220));
              pQVar20 = *(QDockAreaLayoutItem **)(this + lVar22 + 0x240);
              pQVar2[1].d = *(Data **)(this + lVar22 + 0x238);
              pQVar2[1].ptr = pQVar20;
              *(undefined4 *)&pQVar2[1].size = *(undefined4 *)(this + lVar22 + 0x248);
              lVar22 = lVar22 + 0x70;
            } while (lVar22 != 0x1c0);
            this[0x6dc] = this[0x3a4];
            *(undefined4 *)(this + 0x6d8) = *(undefined4 *)(this + 0x3a0);
            QArrayDataPointer<QWidget_*>::operator=
                      ((QArrayDataPointer<QWidget_*> *)(this + 0x6e0),
                       (QArrayDataPointer<QWidget_*> *)(this + 0x3a8));
          }
        }
        lVar22 = QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
        if (lVar22 != 0) {
          QToolBarPrivate::unplug(*(QToolBarPrivate **)(lVar22 + 8),(QRect *)local_f8);
        }
        QMainWindowLayoutState::unplug(this_00,(QList<int> *)&local_88,other);
        RVar8.m_i = (other->rect).y1.m_i;
        uVar3 = *(undefined8 *)(this + 0x3c8);
        (this_01->rect).x1 = (Representation)(other->rect).x1.m_i;
        (this_01->rect).y1 = (Representation)RVar8.m_i;
        *(undefined8 *)(this + 0x3e0) = uVar3;
        QVar28 = QToolBarAreaLayout::fitLayout(this_01);
        *(QRect *)(this + 0x4e8) = QVar28;
        QDockAreaLayout::fitLayout((QDockAreaLayout *)(this + 0x4d8));
        QArrayDataPointer<int>::operator=((QArrayDataPointer<int> *)(this + 0x7b0),&local_88);
        *(undefined8 *)(this + 0x7c8) = local_f8._0_8_;
        *(QWidgetData **)(this + 2000) = stack0xffffffffffffff10;
        updateGapIndicator(this);
        unaff_R12.stream = local_b0.stream;
        fixToolBarOrientation((QLayoutItem *)local_b0.stream,*(int *)(*(long *)(this + 0x7b8) + 4));
      }
    }
    if (&(local_88.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_00437b34;
    LOCK();
    ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    iVar16 = ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    pQVar7 = &(local_88.d)->super_QArrayData;
  }
  else {
    if (scope == Group) {
      pQVar23 = QDockWidgetGroupWindow::tabLayoutInfo((QDockWidgetGroupWindow *)pQVar18);
      if (pQVar23 != (QDockAreaLayoutInfo *)0x0) {
        pQVar23 = dockInfo(this,*(QWidget **)(*(long *)&widget->field_0x8 + 0x10));
        if (pQVar23 != (QDockAreaLayoutInfo *)0x0) {
          local_68._16_4_ = 0xaaaaaaaa;
          local_68._20_4_ = 0xaaaaaaaa;
          local_68._0_4_ = 0xaaaaaaaa;
          local_68._4_4_ = 0xaaaaaaaa;
          local_68._8_4_ = 0xaaaaaaaa;
          local_68._12_4_ = 0xaaaaaaaa;
          QDockAreaLayoutInfo::indexOf
                    ((QList<int> *)local_68,pQVar23,
                     *(QWidget **)(*(long *)&widget->field_0x8 + 0x10));
          if (CONCAT44(local_68._20_4_,local_68._16_4_) == 0) {
            unaff_R12.stream = (Stream *)0x0;
          }
          else {
            pQVar20 = QDockAreaLayoutInfo::item(pQVar23,(QList<int> *)local_68);
            unaff_R12.stream = (Stream *)pQVar20->widgetItem;
          }
          piVar6 = (int *)CONCAT44(local_68._4_4_,local_68._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(local_68._4_4_,local_68._0_4_),4,0x10);
            }
          }
        }
        if (pQVar23 == (QDockAreaLayoutInfo *)0x0) {
          pQVar21 = QtPrivateLogging::lcQpaDockWidgets();
          if (((pQVar21->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
            local_68._24_8_ = pQVar21->name;
            local_68._0_4_ = 2;
            local_68._4_4_ = 0;
            local_68._8_4_ = 0;
            local_68._12_4_ = 0;
            local_68._16_4_ = 0;
            local_68._20_4_ = 0;
            QMessageLogger::debug();
            pDVar12 = local_a8.d.d;
            QVar33.m_data = &DAT_0000000a;
            QVar33.m_size = (qsizetype)&local_e0;
            QString::fromUtf8(QVar33);
            QTextStream::operator<<((QTextStream *)pDVar12,(QString *)&local_e0);
            piVar6 = (int *)CONCAT44(iStack_dc,local_e0);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                QArrayData::deallocate((QArrayData *)CONCAT44(iStack_dc,local_e0),2,0x10);
              }
            }
            if ((char)local_a8.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i
                == '\x01') {
              QTextStream::operator<<((QTextStream *)local_a8.d.d,' ');
            }
            local_90 = (undefined1  [8])local_a8.d.d;
            *(int *)&local_a8.d.d[2].super_QArrayData.alloc =
                 (int)local_a8.d.d[2].super_QArrayData.alloc + 1;
            ::operator<<((Stream *)&local_88,(QWidget *)local_90);
            pDVar12 = local_88.d;
            QVar34.m_data = (storage_type *)0x6;
            QVar34.m_size = (qsizetype)&local_e0;
            QString::fromUtf8(QVar34);
            QTextStream::operator<<((QTextStream *)pDVar12,(QString *)&local_e0);
            piVar6 = (int *)CONCAT44(iStack_dc,local_e0);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                QArrayData::deallocate((QArrayData *)CONCAT44(iStack_dc,local_e0),2,0x10);
              }
            }
            if ((char)local_88.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
                '\x01') {
              QTextStream::operator<<((QTextStream *)local_88.d,' ');
            }
            QTextStream::operator<<((QTextStream *)local_88.d,"true");
            if ((char)local_88.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
                '\x01') {
              QTextStream::operator<<((QTextStream *)local_88.d,' ');
            }
            QDebug::~QDebug((QDebug *)&local_88);
            QDebug::~QDebug((QDebug *)local_90);
            QDebug::~QDebug((QDebug *)&local_a8);
          }
          unaff_R12.stream = (Stream *)0x0;
        }
        goto LAB_00437b34;
      }
    }
    local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar19 = QWidget::layout(pQVar18);
    QDockAreaLayoutInfo::indexOf
              (&local_a8,(QDockAreaLayoutInfo *)&pQVar19[4].super_QLayoutItem,widget);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_68._16_4_ = 0xaaaaaaaa;
    local_68._20_4_ = 0xaaaaaaaa;
    local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._0_4_ = 0xaaaaaaaa;
    local_68._4_4_ = 0xaaaaaaaa;
    local_68._8_4_ = 0xaaaaaaaa;
    local_68._12_4_ = 0xaaaaaaaa;
    pQVar19 = QWidget::layout(pQVar18);
    pQVar20 = QDockAreaLayoutInfo::item
                        ((QDockAreaLayoutInfo *)&pQVar19[4].super_QLayoutItem,&local_a8);
    QDockAreaLayoutItem::QDockAreaLayoutItem((QDockAreaLayoutItem *)local_68,pQVar20);
    local_f8._4_4_ = local_68._4_4_;
    local_f8._0_4_ = local_68._0_4_;
    if (((scope == Group) && ((QWidgetData *)0x1 < (ulong)local_a8.d.size)) &&
       (bVar13 = unplugGroup((QMainWindowLayout *)this,(QLayoutItem **)local_f8,
                             (QDockAreaLayoutItem *)local_68), bVar13)) {
      pQVar21 = QtPrivateLogging::lcQpaDockWidgets();
      if (((pQVar21->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
        local_c8 = (QWidgetData *)pQVar21->name;
        local_e0 = 2;
        iStack_dc = 0;
        uStack_d8._0_1_ = (QPaintDevice)0x0;
        uStack_d8._1_3_ = 0;
        uStack_d4 = 0;
        local_cc = 0;
        QMessageLogger::debug();
        QVar10 = local_c0;
        QVar29.m_data = &DAT_0000000b;
        QVar29.m_size = (qsizetype)&local_88;
        QString::fromUtf8(QVar29);
        QTextStream::operator<<((QTextStream *)QVar10,(QString *)&local_88);
        if (&(local_88.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_88.d)->super_QArrayData,2,0x10);
          }
        }
        if (*(QTextStream *)((long)local_c0 + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_c0,' ');
        }
        local_b8._0_4_ = local_c0.wd.m_i;
        local_b8._4_4_ = local_c0.ht.m_i;
        *(int *)((long)local_c0 + 0x28) = *(int *)((long)local_c0 + 0x28) + 1;
        ::operator<<((Stream *)&local_b0,(QWidget *)local_b8);
        QVar11.stream = local_b0.stream;
        QVar30.m_data = (storage_type *)0x4;
        QVar30.m_size = (qsizetype)&local_88;
        QString::fromUtf8(QVar30);
        QTextStream::operator<<((QTextStream *)QVar11.stream,(QString *)&local_88);
        if (&(local_88.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_88.d)->super_QArrayData,2,0x10);
          }
        }
        if (*(char *)&((QLayoutItem *)(local_b0.stream + 0x30))->_vptr_QLayoutItem == '\x01') {
          QTextStream::operator<<((QTextStream *)local_b0.stream,' ');
        }
        QTextStream::operator<<((QTextStream *)local_b0.stream,(void *)local_f8._0_8_);
        if (*(char *)&((QLayoutItem *)(local_b0.stream + 0x30))->_vptr_QLayoutItem == '\x01') {
          QTextStream::operator<<((QTextStream *)local_b0.stream,' ');
        }
        QDebug::~QDebug(&local_b0);
        this_03 = (QDebug *)local_b8;
LAB_004373ec:
        QDebug::~QDebug(this_03);
        QDebug::~QDebug((QDebug *)&local_c0);
      }
    }
    else {
      lVar22 = QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
      QDockWidgetPrivate::unplug(*(QDockWidgetPrivate **)(lVar22 + 8),&widget->data->crect);
      pQVar21 = QtPrivateLogging::lcQpaDockWidgets();
      if (((pQVar21->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
        local_c8 = (QWidgetData *)pQVar21->name;
        local_e0 = 2;
        iStack_dc = 0;
        uStack_d8._0_1_ = (QPaintDevice)0x0;
        uStack_d8._1_3_ = 0;
        uStack_d4 = 0;
        local_cc = 0;
        QMessageLogger::debug();
        QVar10 = local_c0;
        QVar31.m_data = (storage_type *)0x1d;
        QVar31.m_size = (qsizetype)&local_88;
        QString::fromUtf8(QVar31);
        QTextStream::operator<<((QTextStream *)QVar10,(QString *)&local_88);
        if (&(local_88.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_88.d)->super_QArrayData,2,0x10);
          }
        }
        if (*(QTextStream *)((long)local_c0 + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_c0,' ');
        }
        local_e8._0_4_ = local_c0.wd.m_i;
        local_e8._4_4_ = local_c0.ht.m_i;
        *(int *)((long)local_c0 + 0x28) = *(int *)((long)local_c0 + 0x28) + 1;
        ::operator<<((Stream *)&local_b0,(QWidget *)local_e8);
        QVar11.stream = local_b0.stream;
        QVar32.m_data = (storage_type *)0x4;
        QVar32.m_size = (qsizetype)&local_88;
        QString::fromUtf8(QVar32);
        QTextStream::operator<<((QTextStream *)QVar11.stream,(QString *)&local_88);
        if (&(local_88.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_88.d)->super_QArrayData,2,0x10);
          }
        }
        if (*(char *)&((QLayoutItem *)(local_b0.stream + 0x30))->_vptr_QLayoutItem == '\x01') {
          QTextStream::operator<<((QTextStream *)local_b0.stream,' ');
        }
        QTextStream::operator<<
                  ((QTextStream *)local_b0.stream,(void *)CONCAT44(local_68._4_4_,local_68._0_4_));
        if (*(char *)&((QLayoutItem *)(local_b0.stream + 0x30))->_vptr_QLayoutItem == '\x01') {
          QTextStream::operator<<((QTextStream *)local_b0.stream,' ');
        }
        QDebug::~QDebug(&local_b0);
        this_03 = (QDebug *)local_e8;
        goto LAB_004373ec;
      }
    }
    unaff_R12.stream = (Stream *)local_f8._0_8_;
    QDockAreaLayoutItem::~QDockAreaLayoutItem((QDockAreaLayoutItem *)local_68);
    if (&(local_a8.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_00437b34;
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    iVar16 = ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    pQVar7 = &(local_a8.d.d)->super_QArrayData;
  }
  if (iVar16 == 0) {
    QArrayData::deallocate(pQVar7,4,0x10);
  }
LAB_00437b34:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QLayoutItem *)unaff_R12.stream;
}

Assistant:

QLayoutItem *QMainWindowLayout::unplug(QWidget *widget, QDockWidgetPrivate::DragScope scope)
{
#if QT_CONFIG(dockwidget) && QT_CONFIG(tabwidget)
    auto *groupWindow = qobject_cast<const QDockWidgetGroupWindow *>(widget->parentWidget());
    if (!widget->isWindow() && groupWindow) {
        if (scope == QDockWidgetPrivate::DragScope::Group && groupWindow->tabLayoutInfo()) {
            // We are just dragging a floating window as it, not need to do anything, we just have to
            // look up the corresponding QWidgetItem* if it exists
            if (QDockAreaLayoutInfo *info = dockInfo(widget->parentWidget())) {
                QList<int> groupWindowPath = info->indexOf(widget->parentWidget());
                return groupWindowPath.isEmpty() ? nullptr : info->item(groupWindowPath).widgetItem;
            }
            qCDebug(lcQpaDockWidgets) << "Drag only:" << widget << "Group:" << (scope == QDockWidgetPrivate::DragScope::Group);
            return nullptr;
        }
        QList<int> path = groupWindow->layoutInfo()->indexOf(widget);
        QDockAreaLayoutItem parentItem = groupWindow->layoutInfo()->item(path);
        QLayoutItem *item = parentItem.widgetItem;
        if (scope == QDockWidgetPrivate::DragScope::Group && path.size() > 1
            && unplugGroup(this, &item, parentItem)) {
            qCDebug(lcQpaDockWidgets) << "Unplugging:" << widget << "from" << item;
            return item;
        } else {
            // We are unplugging a single dock widget from a floating window.
            QDockWidget *dockWidget = qobject_cast<QDockWidget *>(widget);
            Q_ASSERT(dockWidget); // cannot be a QDockWidgetGroupWindow because it's not floating.
            dockWidget->d_func()->unplug(widget->geometry());

            qCDebug(lcQpaDockWidgets) << "Unplugged from floating dock:" << widget << "from" << parentItem.widgetItem;
            return item;
        }
    }
#endif
    QList<int> path = layoutState.indexOf(widget);
    if (path.isEmpty())
        return nullptr;

    QLayoutItem *item = layoutState.item(path);
    if (widget->isWindow())
        return item;

    QRect r = layoutState.itemRect(path);
    savedState = layoutState;

#if QT_CONFIG(dockwidget)
    if (QDockWidget *dw = qobject_cast<QDockWidget*>(widget)) {
        Q_ASSERT(path.constFirst() == 1);
#if QT_CONFIG(tabwidget)
        if (scope == QDockWidgetPrivate::DragScope::Group && (dockOptions & QMainWindow::GroupedDragging) && path.size() > 3
            && unplugGroup(this, &item,
                           layoutState.dockAreaLayout.item(path.mid(1, path.size() - 2)))) {
            path.removeLast();
            savedState = layoutState;
        } else
#endif // QT_CONFIG(tabwidget)
        {
            // Dock widget is unplugged from a main window dock
            // => height or width need to be decreased by separator size
            switch (dockWidgetArea(dw)) {
            case Qt::LeftDockWidgetArea:
            case Qt::RightDockWidgetArea:
                r.setHeight(r.height() - sep);
                break;
            case Qt::TopDockWidgetArea:
            case Qt::BottomDockWidgetArea:
                r.setWidth(r.width() - sep);
                break;
            case Qt::NoDockWidgetArea:
            case Qt::DockWidgetArea_Mask:
                break;
            }

            // Depending on the title bar layout (vertical / horizontal),
            // width and height have to provide minimum space for window handles
            // and mouse dragging.
            // Assuming horizontal title bar, if the dock widget does not have a layout.
            const auto *layout = qobject_cast<QDockWidgetLayout *>(dw->layout());
            const bool verticalTitleBar = layout ? layout->verticalTitleBar : false;
            const int tbHeight = QApplication::style()
                      ? QApplication::style()->pixelMetric(QStyle::PixelMetric::PM_TitleBarHeight, nullptr, dw)
                      : 20;
            const int minHeight = verticalTitleBar ? 2 * tbHeight : tbHeight;
            const int minWidth = verticalTitleBar ? tbHeight : 2 * tbHeight;
            r.setSize(r.size().expandedTo(QSize(minWidth, minHeight)));
            qCDebug(lcQpaDockWidgets) << dw << "will be unplugged with size" << r.size();

            dw->d_func()->unplug(r);
        }
    }
#endif // QT_CONFIG(dockwidget)
#if QT_CONFIG(toolbar)
    if (QToolBar *tb = qobject_cast<QToolBar*>(widget)) {
        tb->d_func()->unplug(r);
    }
#endif

#if !QT_CONFIG(dockwidget) || !QT_CONFIG(tabbar)
    Q_UNUSED(scope);
#endif

    layoutState.unplug(path ,&savedState);
    savedState.fitLayout();
    currentGapPos = path;
    currentGapRect = r;
    updateGapIndicator();

    fixToolBarOrientation(item, currentGapPos.at(1));

    return item;
}